

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void YuvToArgbRow_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst,int len)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  undefined1 auVar11 [14];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  uint3 uVar14;
  unkbyte9 Var15;
  uint5 uVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [14];
  uint uVar19;
  long lVar20;
  undefined2 uVar21;
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  __m128i B;
  __m128i G;
  __m128i R;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  undefined4 uVar22;
  undefined6 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [14];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  for (lVar20 = 0; (int)lVar20 + 8 <= len; lVar20 = lVar20 + 8) {
    YUV420ToRGB_SSE2(y + lVar20,u,v,(__m128i *)&local_48,(__m128i *)&local_58,(__m128i *)&local_68);
    cVar5 = (0 < local_58) * (local_58 < 0x100) * (char)local_58 - (0xff < local_58);
    uVar21 = CONCAT11(cVar5,0xff);
    cVar6 = (0 < sStack_56) * (sStack_56 < 0x100) * (char)sStack_56 - (0xff < sStack_56);
    uVar14 = CONCAT12(cVar6,uVar21);
    cVar7 = (0 < sStack_54) * (sStack_54 < 0x100) * (char)sStack_54 - (0xff < sStack_54);
    uVar22 = CONCAT13(cVar7,uVar14);
    cVar8 = (0 < sStack_52) * (sStack_52 < 0x100) * (char)sStack_52 - (0xff < sStack_52);
    uVar16 = CONCAT14(cVar8,uVar22);
    auVar17._5_7_ = 0;
    auVar17._0_5_ = uVar16;
    cVar9 = (0 < sStack_50) * (sStack_50 < 0x100) * (char)sStack_50 - (0xff < sStack_50);
    uVar23 = CONCAT15(cVar9,uVar16);
    cVar10 = (0 < sStack_4e) * (sStack_4e < 0x100) * (char)sStack_4e - (0xff < sStack_4e);
    auVar18[6] = cVar10;
    auVar18._0_6_ = uVar23;
    auVar18._7_7_ = 0;
    auVar35[0xe] = 0xff;
    auVar35._0_14_ = auVar18 << 0x38;
    auVar35[0xf] = (0 < sStack_3a) * (sStack_3a < 0x100) * (char)sStack_3a - (0xff < sStack_3a);
    auVar34._13_3_ =
         (undefined3)
         (CONCAT27(auVar35._14_2_,
                   CONCAT16((0 < sStack_3c) * (sStack_3c < 0x100) * (char)sStack_3c -
                            (0xff < sStack_3c),uVar23)) >> 0x30);
    auVar34[0xc] = 0xff;
    auVar34._0_12_ = auVar17 << 0x38;
    auVar33._11_5_ =
         (undefined5)
         (CONCAT45(auVar34._12_4_,
                   CONCAT14((0 < sStack_3e) * (sStack_3e < 0x100) * (char)sStack_3e -
                            (0xff < sStack_3e),uVar22)) >> 0x20);
    auVar33[10] = 0xff;
    auVar33._0_10_ = (unkuint10)uVar14 << 0x38;
    Var15 = CONCAT72((int7)(CONCAT63(auVar33._10_6_,
                                     CONCAT12((0 < sStack_40) * (sStack_40 < 0x100) *
                                              (char)sStack_40 - (0xff < sStack_40),uVar21)) >> 0x10)
                     ,0xffff);
    Var13 = CONCAT91(CONCAT81((long)((unkuint9)Var15 >> 8),
                              (0 < sStack_42) * (sStack_42 < 0x100) * (char)sStack_42 -
                              (0xff < sStack_42)),0xff);
    auVar12._2_10_ = Var13;
    auVar12[1] = (0 < sStack_44) * (sStack_44 < 0x100) * (char)sStack_44 - (0xff < sStack_44);
    auVar12[0] = 0xff;
    auVar11._2_12_ = auVar12;
    auVar11[1] = (0 < sStack_46) * (sStack_46 < 0x100) * (char)sStack_46 - (0xff < sStack_46);
    auVar11[0] = 0xff;
    auVar32._0_2_ =
         CONCAT11((0 < local_48) * (local_48 < 0x100) * (char)local_48 - (0xff < local_48),0xff);
    auVar32._2_14_ = auVar11;
    uVar21 = CONCAT11((0 < local_68) * (local_68 < 0x100) * (char)local_68 - (0xff < local_68),cVar5
                     );
    uVar22 = CONCAT13((0 < sStack_66) * (sStack_66 < 0x100) * (char)sStack_66 - (0xff < sStack_66),
                      CONCAT12(cVar6,uVar21));
    uVar23 = CONCAT15((0 < sStack_64) * (sStack_64 < 0x100) * (char)sStack_64 - (0xff < sStack_64),
                      CONCAT14(cVar7,uVar22));
    uVar24 = CONCAT17((0 < sStack_62) * (sStack_62 < 0x100) * (char)sStack_62 - (0xff < sStack_62),
                      CONCAT16(cVar8,uVar23));
    auVar25._0_10_ =
         CONCAT19((0 < sStack_60) * (sStack_60 < 0x100) * (char)sStack_60 - (0xff < sStack_60),
                  CONCAT18(cVar9,uVar24));
    auVar25[10] = cVar10;
    auVar25[0xb] = (0 < sStack_5e) * (sStack_5e < 0x100) * (char)sStack_5e - (0xff < sStack_5e);
    auVar26[0xc] = (0 < sStack_4c) * (sStack_4c < 0x100) * (char)sStack_4c - (0xff < sStack_4c);
    auVar26._0_12_ = auVar25;
    auVar26[0xd] = (0 < sStack_5c) * (sStack_5c < 0x100) * (char)sStack_5c - (0xff < sStack_5c);
    auVar27[0xe] = (0 < sStack_4a) * (sStack_4a < 0x100) * (char)sStack_4a - (0xff < sStack_4a);
    auVar27._0_14_ = auVar26;
    auVar27[0xf] = (0 < sStack_5a) * (sStack_5a < 0x100) * (char)sStack_5a - (0xff < sStack_5a);
    auVar31._0_12_ = auVar32._0_12_;
    auVar31._12_2_ = (short)Var13;
    auVar31._14_2_ = (short)((ulong)uVar24 >> 0x30);
    auVar30._12_4_ = auVar31._12_4_;
    auVar30._0_10_ = auVar32._0_10_;
    auVar30._10_2_ = (short)((uint6)uVar23 >> 0x20);
    auVar29._10_6_ = auVar30._10_6_;
    auVar29._0_8_ = auVar32._0_8_;
    auVar29._8_2_ = auVar12._0_2_;
    auVar28._8_8_ = auVar29._8_8_;
    auVar28._6_2_ = (short)((uint)uVar22 >> 0x10);
    auVar28._4_2_ = auVar11._0_2_;
    auVar28._2_2_ = uVar21;
    auVar28._0_2_ = auVar32._0_2_;
    *(undefined1 (*) [16])(dst + lVar20 * 4) = auVar28;
    puVar1 = dst + lVar20 * 4 + 0x10;
    *(short *)puVar1 = (short)((unkuint9)Var15 >> 8);
    *(short *)(puVar1 + 2) = (short)((unkuint10)auVar25._0_10_ >> 0x40);
    *(short *)(puVar1 + 4) = auVar33._10_2_;
    *(short *)(puVar1 + 6) = auVar25._10_2_;
    *(short *)(puVar1 + 8) = auVar34._12_2_;
    *(short *)(puVar1 + 10) = auVar26._12_2_;
    *(short *)(puVar1 + 0xc) = auVar35._14_2_;
    *(short *)(puVar1 + 0xe) = auVar27._14_2_;
    u = u + 4;
    v = v + 4;
  }
  for (; (int)(uint)lVar20 < len; lVar20 = lVar20 + 1) {
    bVar2 = y[lVar20];
    bVar3 = *u;
    bVar4 = *v;
    dst[lVar20 * 4] = 0xff;
    VP8YuvToRgb((uint)bVar2,(uint)bVar3,(uint)bVar4,dst + lVar20 * 4 + 1);
    uVar19 = (uint)lVar20 & 1;
    u = u + uVar19;
    v = v + uVar19;
  }
  return;
}

Assistant:

static void YuvToArgbRow_SSE2(const uint8_t* WEBP_RESTRICT y,
                              const uint8_t* WEBP_RESTRICT u,
                              const uint8_t* WEBP_RESTRICT v,
                              uint8_t* WEBP_RESTRICT dst, int len) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n + 8 <= len; n += 8, dst += 32) {
    __m128i R, G, B;
    YUV420ToRGB_SSE2(y, u, v, &R, &G, &B);
    PackAndStore4_SSE2(&kAlpha, &R, &G, &B, dst);
    y += 8;
    u += 4;
    v += 4;
  }
  for (; n < len; ++n) {   // Finish off
    VP8YuvToArgb(y[0], u[0], v[0], dst);
    dst += 4;
    y += 1;
    u += (n & 1);
    v += (n & 1);
  }
}